

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elapsed_time.hpp
# Opt level: O0

longlong __thiscall ElapsedTime::SetEndTime(ElapsedTime *this,ENUM_TIME_RESOLUTION resolution)

{
  rep_conflict rVar1;
  int in_ESI;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_RDI;
  microsecs_t duration_1;
  millisecs_t duration;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffffc0;
  duration<long_long,_std::ratio<1L,_1000000L>_> in_stack_ffffffffffffffc8;
  duration<int,_std::ratio<1L,_1000L>_> local_24;
  rep local_20;
  int local_14;
  long local_8;
  
  local_14 = in_ESI;
  local_20 = std::chrono::_V2::steady_clock::now();
  in_RDI[1].__r = local_20;
  if (local_14 == 0) {
    std::chrono::operator-
              ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)in_stack_ffffffffffffffc8.__r,in_stack_ffffffffffffffc0);
    local_24.__r = (rep_conflict)
                   std::chrono::
                   duration_cast<std::chrono::duration<int,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                             (in_RDI);
    rVar1 = std::chrono::duration<int,_std::ratio<1L,_1000L>_>::count(&local_24);
    local_8 = (long)rVar1;
  }
  else if (local_14 == 1) {
    std::chrono::operator-
              ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)in_stack_ffffffffffffffc8.__r,in_stack_ffffffffffffffc0);
    std::chrono::
    duration_cast<std::chrono::duration<long_long,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000000l>>
              (in_RDI);
    local_8 = std::chrono::duration<long_long,_std::ratio<1L,_1000000L>_>::count
                        ((duration<long_long,_std::ratio<1L,_1000000L>_> *)&stack0xffffffffffffffc8)
    ;
  }
  else {
    local_8 = -1;
  }
  return local_8;
}

Assistant:

long long SetEndTime( ENUM_TIME_RESOLUTION resolution) {
            end_time_ = std::chrono::steady_clock::now(); 

            if(resolution == MILLI_SEC_RESOLUTION) {
                millisecs_t duration(std::chrono::duration_cast<millisecs_t>(end_time_ - start_time_));
                return duration.count();
            } else if (resolution == MICRO_SEC_RESOLUTION) {
                microsecs_t duration(std::chrono::duration_cast<microsecs_t>(end_time_ - start_time_));
                return duration.count();
            }
            return -1; //error
        }